

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::CacheTestParam::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  bool in_CL;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_20;
  undefined1 local_19;
  deUint32 ndx;
  CacheTestParam *this_local;
  string *result;
  
  local_19 = 0;
  _ndx = this;
  this_local = (CacheTestParam *)__return_storage_ptr__;
  getShaderFlagStr_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + 8),0,
             in_CL);
  for (local_20 = 1; (ulong)local_20 < *(ulong *)((long)this + 0x20); local_20 = local_20 + 1) {
    getShaderFlagStr_abi_cxx11_
              (&local_60,
               (_anonymous_namespace_ *)(ulong)*(uint *)((long)this + (ulong)local_20 * 4 + 8),0,
               SUB41(local_20,0));
    std::operator+(&local_40,'_',&local_60);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string CacheTestParam::generateTestName (void) const
{
	std::string result(getShaderFlagStr(m_shaders[0], false));

	for(deUint32 ndx = 1; ndx < m_shaderCount; ndx++)
		result += '_' + getShaderFlagStr(m_shaders[ndx], false) ;

	return result;
}